

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * __thiscall
phosg::StringReader::pget_cstr_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,size_t offset)

{
  char __c;
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    pcVar1 = pget<signed_char>(this,__return_storage_ptr__->_M_string_length + offset,1);
    __c = *pcVar1;
    if (__c == '\0') {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,__c);
  } while (__c != '\0');
  return __return_storage_ptr__;
}

Assistant:

string StringReader::pget_cstr(size_t offset) const {
  string ret;
  for (;;) {
    uint8_t ch = this->pget_s8(offset + ret.size());
    if (ch != 0) {
      ret += ch;
    } else {
      break;
    }
  }
  return ret;
}